

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void update_effects(DUMB_IT_SIGRENDERER *sigrenderer)

{
  IT_PLAYING *pIVar1;
  byte bVar2;
  int iVar3;
  DUMB_IT_SIGRENDERER *channel_00;
  long *in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  IT_PLAYING *playing_1;
  float destdelta;
  float deltaslid;
  float deltanote;
  float amiga_multiplier;
  int destpitch;
  int currpitch;
  int clip;
  IT_PLAYING *playing;
  IT_CHANNEL *channel;
  int i;
  IT_CHANNEL *in_stack_ffffffffffffff98;
  DUMB_IT_SIGRENDERER *in_stack_ffffffffffffffa0;
  int local_54;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_28;
  int local_c;
  
  if ((*(char *)((long)in_RDI + 0x11) != '\0') &&
     (*(char *)(in_RDI + 2) = (char)in_RDI[2] + *(char *)((long)in_RDI + 0x11),
     0x80 < *(byte *)(in_RDI + 2))) {
    if (*(char *)((long)in_RDI + 0x11) < '\0') {
      *(undefined1 *)(in_RDI + 2) = 0;
    }
    else {
      *(undefined1 *)(in_RDI + 2) = 0x80;
    }
  }
  if (((char)in_RDI[3] != '\0') &&
     (*(int *)((long)in_RDI + 0x14) = (int)(char)in_RDI[3] + *(int *)((long)in_RDI + 0x14),
     *(int *)((long)in_RDI + 0x14) < 0x20)) {
    if ((char)in_RDI[3] < '\0') {
      *(undefined4 *)((long)in_RDI + 0x14) = 0x20;
    }
    else {
      *(undefined4 *)((long)in_RDI + 0x14) = 0xff;
    }
  }
  for (local_c = 0; local_c < 0x40; local_c = local_c + 1) {
    channel_00 = (DUMB_IT_SIGRENDERER *)(in_RDI + (long)local_c * 0x14 + 4);
    pIVar1 = *(IT_PLAYING **)&channel_00->channel[0].lastYspeed;
    if ((*(char *)((long)&channel_00->sigdata + 6) != '\0') &&
       (*(uchar *)((long)&channel_00->sigdata + 4) =
             *(uchar *)((long)&channel_00->sigdata + 4) + *(char *)((long)&channel_00->sigdata + 6),
       0x40 < *(uchar *)((long)&channel_00->sigdata + 4))) {
      if (*(char *)((long)&channel_00->sigdata + 6) < '\0') {
        *(uchar *)((long)&channel_00->sigdata + 4) = '\0';
      }
      else {
        *(uchar *)((long)&channel_00->sigdata + 4) = '@';
      }
    }
    if (*(char *)((long)&channel_00->sigdata + 5) != '\0') {
      bVar2 = 0x40;
      if ((*(uint *)(*in_RDI + 100) & 0x100) != 0) {
        bVar2 = 0x3f;
      }
      *(uchar *)((long)&channel_00->sigdata + 4) =
           *(uchar *)((long)&channel_00->sigdata + 4) + *(char *)((long)&channel_00->sigdata + 5);
      if (bVar2 < *(uchar *)((long)&channel_00->sigdata + 4)) {
        if (*(char *)((long)&channel_00->sigdata + 5) < '\0') {
          *(uchar *)((long)&channel_00->sigdata + 4) = '\0';
        }
        else {
          *(byte *)((long)&channel_00->sigdata + 4) = bVar2;
        }
      }
    }
    if (*(char *)((long)&channel_00->sigdata + 7) != '\0') {
      if ((*(uint *)(*in_RDI + 100) & 0x40) == 0) {
        if (0x40 < (byte)channel_00->n_channels) {
          *(uchar *)&channel_00->n_channels = ' ';
        }
        *(uchar *)&channel_00->n_channels =
             (uchar)channel_00->n_channels + *(char *)((long)&channel_00->sigdata + 7);
        if (0x40 < (byte)channel_00->n_channels) {
          if (*(char *)((long)&channel_00->sigdata + 7) < '\0') {
            *(uchar *)&channel_00->n_channels = '\0';
          }
          else {
            *(uchar *)&channel_00->n_channels = '@';
          }
        }
        *(ushort *)((long)&channel_00->n_channels + 2) = (ushort)(byte)channel_00->n_channels << 8;
      }
      else {
        if (0x40 < (byte)channel_00->n_channels) {
          *(uchar *)&channel_00->n_channels = ' ';
          *(unsigned_short *)((long)&channel_00->n_channels + 2) = 0x2020;
        }
        if (*(char *)((long)&channel_00->sigdata + 7) == -0x80) {
          *(unsigned_short *)((long)&channel_00->n_channels + 2) = 0x20;
        }
        else {
          if ((int)((uint)*(unsigned_short *)((long)&channel_00->n_channels + 2) +
                   *(char *)((long)&channel_00->sigdata + 7) * 0x40) < 0x3fe0) {
            in_stack_ffffffffffffffb4 =
                 (uint)*(unsigned_short *)((long)&channel_00->n_channels + 2) +
                 *(char *)((long)&channel_00->sigdata + 7) * 0x40;
          }
          else {
            in_stack_ffffffffffffffb4 = 0x3fe0;
          }
          if (in_stack_ffffffffffffffb4 < 0x20) {
            local_54 = 0x20;
          }
          else if ((int)((uint)*(unsigned_short *)((long)&channel_00->n_channels + 2) +
                        *(char *)((long)&channel_00->sigdata + 7) * 0x40) < 0x3fe0) {
            local_54 = (uint)*(unsigned_short *)((long)&channel_00->n_channels + 2) +
                       *(char *)((long)&channel_00->sigdata + 7) * 0x40;
          }
          else {
            local_54 = 0x3fe0;
          }
          *(unsigned_short *)((long)&channel_00->n_channels + 2) = (unsigned_short)local_54;
          in_stack_ffffffffffffffb0 = local_54;
        }
      }
    }
    if ((*(char *)((long)&channel_00->resampling_quality + 1) != '\0') &&
       (*(uchar *)&channel_00->resampling_quality =
             (uchar)channel_00->resampling_quality +
             *(char *)((long)&channel_00->resampling_quality + 1),
       0x40 < (byte)channel_00->resampling_quality)) {
      if (*(char *)((long)&channel_00->resampling_quality + 1) < '\0') {
        *(uchar *)&channel_00->resampling_quality = '\0';
      }
      else {
        *(uchar *)&channel_00->resampling_quality = '@';
      }
    }
    update_tremor((IT_CHANNEL *)channel_00);
    update_retrig(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (*(uchar *)((long)&channel_00->channel[0].sample + 1) != '\0') {
      if (pIVar1 == (IT_PLAYING *)0x0) {
        in_stack_ffffffffffffff98 = (IT_CHANNEL *)0x0;
      }
      else {
        in_stack_ffffffffffffff98 = (IT_CHANNEL *)pIVar1->sample;
      }
      in_stack_ffffffffffffffa0 = channel_00;
      update_invert_loop((IT_CHANNEL *)channel_00,(IT_SAMPLE *)in_stack_ffffffffffffff98);
    }
    if (pIVar1 != (IT_PLAYING *)0x0) {
      pIVar1->slide = *(int *)&channel_00->channel[0].arpeggio_table + pIVar1->slide;
      if ((*(uint *)(*in_RDI + 100) & 8) == 0) {
        if ((*(int *)((long)&channel_00->channel[0].arpeggio_table + 4) != 0) &&
           (channel_00->channel[0].xm_retrig < 0x78)) {
          fVar4 = (float)pIVar1->sample->C5_speed * 1.7621046e-08;
          dVar7 = pow(1.0594630943592953,(double)(int)(0x3c - (uint)pIVar1->note));
          fVar5 = (float)dVar7;
          iVar3 = pIVar1->slide;
          dVar7 = pow(1.0594630943592953,
                      (double)(int)(0x3c - (uint)channel_00->channel[0].xm_retrig));
          fVar6 = (float)dVar7;
          if (fVar6 <= fVar5 - (float)iVar3 * fVar4) {
            pIVar1->slide =
                 *(int *)((long)&channel_00->channel[0].arpeggio_table + 4) + pIVar1->slide;
            if (fVar5 - (float)pIVar1->slide * fVar4 < fVar6) {
              pIVar1->note = channel_00->channel[0].xm_retrig;
              pIVar1->slide = 0;
              channel_00->channel[0].xm_retrig = 0xff;
            }
          }
          else {
            pIVar1->slide =
                 pIVar1->slide - *(int *)((long)&channel_00->channel[0].arpeggio_table + 4);
            if (fVar6 < fVar5 - (float)pIVar1->slide * fVar4) {
              pIVar1->note = channel_00->channel[0].xm_retrig;
              pIVar1->slide = 0;
              channel_00->channel[0].xm_retrig = 0xff;
            }
          }
        }
      }
      else if ((*(int *)((long)&channel_00->channel[0].arpeggio_table + 4) != 0) &&
              (channel_00->channel[0].xm_retrig < 0x78)) {
        local_28 = (pIVar1->note - 0x3c) * 0x100 + pIVar1->slide;
        iVar3 = (channel_00->channel[0].xm_retrig - 0x3c) * 0x100;
        if (iVar3 < local_28) {
          local_28 = local_28 - *(int *)((long)&channel_00->channel[0].arpeggio_table + 4);
          if (local_28 < iVar3) {
            channel_00->channel[0].xm_retrig = 0xff;
            local_28 = iVar3;
          }
        }
        else if ((local_28 < iVar3) &&
                (local_28 = *(int *)((long)&channel_00->channel[0].arpeggio_table + 4) + local_28,
                iVar3 < local_28)) {
          channel_00->channel[0].xm_retrig = 0xff;
          local_28 = iVar3;
        }
        pIVar1->slide = local_28 + (pIVar1->note - 0x3c) * -0x100;
      }
      update_playing_effects((IT_PLAYING *)in_stack_ffffffffffffffa0);
    }
  }
  for (local_c = 0; local_c < 0xc0; local_c = local_c + 1) {
    if (in_RDI[(long)local_c + 0x504] != 0) {
      update_playing_effects((IT_PLAYING *)in_stack_ffffffffffffffa0);
    }
  }
  update_smooth_effects
            ((DUMB_IT_SIGRENDERER *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

static void update_effects(DUMB_IT_SIGRENDERER *sigrenderer)
{
    int i;

	if (sigrenderer->globalvolslide) {
		sigrenderer->globalvolume += sigrenderer->globalvolslide;
		if (sigrenderer->globalvolume > 128) {
			if (sigrenderer->globalvolslide >= 0)
				sigrenderer->globalvolume = 128;
			else
				sigrenderer->globalvolume = 0;
		}
	}

	if (sigrenderer->temposlide) {
		sigrenderer->tempo += sigrenderer->temposlide;
		if (sigrenderer->tempo < 32) {
			if (sigrenderer->temposlide >= 0)
				sigrenderer->tempo = 255;
			else
				sigrenderer->tempo = 32;
		}
	}

	for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
		IT_CHANNEL *channel = &sigrenderer->channel[i];
		IT_PLAYING *playing = channel->playing;

		if (channel->xm_volslide) {
			channel->volume += channel->xm_volslide;
			if (channel->volume > 64) {
				if (channel->xm_volslide >= 0)
					channel->volume = 64;
				else
					channel->volume = 0;
			}
		}

		if (channel->volslide) {
			int clip = (sigrenderer->sigdata->flags & IT_WAS_AN_S3M) ? 63 : 64;
			channel->volume += channel->volslide;
			if (channel->volume > clip) {
				if (channel->volslide >= 0)
					channel->volume = clip;
				else
					channel->volume = 0;
			}
		}

		if (channel->panslide) {
			if (sigrenderer->sigdata->flags & IT_WAS_AN_XM) {
				if (IT_IS_SURROUND(channel->pan))
				{
					channel->pan = 32;
					channel->truepan = 32 + 128 * 64;
				}
				if (channel->panslide == -128)
					channel->truepan = 32;
				else
					channel->truepan = MID(32, channel->truepan + channel->panslide*64, 32+255*64);
			} else {
				if (IT_IS_SURROUND(channel->pan))
				{
					channel->pan = 32;
				}
				channel->pan += channel->panslide;
				if (channel->pan > 64) {
					if (channel->panslide >= 0)
						channel->pan = 64;
					else
						channel->pan = 0;
				}
				channel->truepan = channel->pan << IT_ENVELOPE_SHIFT;
			}
		}

		if (channel->channelvolslide) {
			channel->channelvolume += channel->channelvolslide;
			if (channel->channelvolume > 64) {
				if (channel->channelvolslide >= 0)
					channel->channelvolume = 64;
				else
					channel->channelvolume = 0;
			}
		}

		update_tremor(channel);

		update_retrig(sigrenderer, channel);

		if (channel->inv_loop_speed) update_invert_loop(channel, playing ? playing->sample : NULL);

		if (playing) {
			playing->slide += channel->portamento;

			if (sigrenderer->sigdata->flags & IT_LINEAR_SLIDES) {
				if (channel->toneporta && channel->destnote < 120) {
					int currpitch = ((playing->note - 60) << 8) + playing->slide;
					int destpitch = (channel->destnote - 60) << 8;
					if (currpitch > destpitch) {
						currpitch -= channel->toneporta;
						if (currpitch < destpitch) {
							currpitch = destpitch;
							channel->destnote = IT_NOTE_OFF;
						}
					} else if (currpitch < destpitch) {
						currpitch += channel->toneporta;
						if (currpitch > destpitch) {
							currpitch = destpitch;
							channel->destnote = IT_NOTE_OFF;
						}
					}
					playing->slide = currpitch - ((playing->note - 60) << 8);
				}
			} else {
				if (channel->toneporta && channel->destnote < 120) {
					float amiga_multiplier = playing->sample->C5_speed * (1.0f / AMIGA_DIVISOR);

					float deltanote = (float)pow(DUMB_SEMITONE_BASE, 60 - playing->note);
					/* deltanote is 1.0 for C-5, 0.5 for C-6, etc. */

					float deltaslid = deltanote - playing->slide * amiga_multiplier;

					float destdelta = (float)pow(DUMB_SEMITONE_BASE, 60 - channel->destnote);
					if (deltaslid < destdelta) {
						playing->slide -= channel->toneporta;
						deltaslid = deltanote - playing->slide * amiga_multiplier;
						if (deltaslid > destdelta) {
							playing->note = channel->destnote;
							playing->slide = 0;
							channel->destnote = IT_NOTE_OFF;
						}
					} else {
						playing->slide += channel->toneporta;
						deltaslid = deltanote - playing->slide * amiga_multiplier;
						if (deltaslid < destdelta) {
							playing->note = channel->destnote;
							playing->slide = 0;
							channel->destnote = IT_NOTE_OFF;
						}
					}
				}
			}

			update_playing_effects(playing);
		}
	}

	for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
		IT_PLAYING *playing = sigrenderer->playing[i];
		if (playing) update_playing_effects(playing);
	}

	update_smooth_effects(sigrenderer);
}